

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::lts_20250127::CondVarEnqueue(SynchWaitParams *waitp)

{
  atomic<long> *paVar1;
  intptr_t iVar2;
  bool bVar3;
  SynchWaitParams *pSVar4;
  __int_type_conflict *p_Var5;
  PerThreadSynch *h;
  char *absl_raw_log_internal_basename;
  SynchWaitParams *pSStack_a0;
  int c;
  intptr_t v;
  atomic<long> *cv_word;
  SynchWaitParams *waitp_local;
  memory_order local_80;
  int local_7c;
  memory_order __b_1;
  SynchWaitParams *local_70;
  memory_order local_68;
  int local_64;
  memory_order __b;
  undefined1 local_51;
  ulong local_50;
  undefined4 local_48;
  undefined4 local_44;
  ulong local_40;
  undefined1 *local_38;
  intptr_t local_30;
  int local_1c;
  memory_order __b_2;
  intptr_t local_10;
  
  paVar1 = waitp->cv_word;
  waitp->cv_word = (atomic<long> *)0x0;
  local_64 = 0;
  v = (intptr_t)paVar1;
  cv_word = (atomic<long> *)waitp;
  ___b = paVar1;
  local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_64 - 1U < 2) {
    local_70 = (SynchWaitParams *)(paVar1->super___atomic_base<long>)._M_i;
  }
  else if (local_64 == 5) {
    local_70 = (SynchWaitParams *)(paVar1->super___atomic_base<long>)._M_i;
  }
  else {
    local_70 = (SynchWaitParams *)(paVar1->super___atomic_base<long>)._M_i;
  }
  pSStack_a0 = local_70;
  absl_raw_log_internal_basename._4_4_ = 0;
  while( true ) {
    bVar3 = true;
    if (((ulong)pSStack_a0 & 1) == 0) {
      local_50 = (ulong)pSStack_a0 | 1;
      local_30 = v;
      local_38 = (undefined1 *)&stack0xffffffffffffff60;
      local_44 = 2;
      local_48 = 0;
      LOCK();
      pSVar4 = *(SynchWaitParams **)v;
      local_51 = pSStack_a0 == pSVar4;
      if ((bool)local_51) {
        *(ulong *)v = local_50;
        pSVar4 = pSStack_a0;
      }
      UNLOCK();
      if (!(bool)local_51) {
        pSStack_a0 = pSVar4;
      }
      bVar3 = !(bool)local_51;
      local_40 = local_50;
    }
    if (!bVar3) break;
    absl_raw_log_internal_basename._4_4_ =
         synchronization_internal::MutexDelay(absl_raw_log_internal_basename._4_4_,1);
    iVar2 = v;
    ___b_1 = v;
    local_7c = 0;
    local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_7c - 1U < 2) {
      waitp_local = *(SynchWaitParams **)iVar2;
    }
    else if (local_7c == 5) {
      waitp_local = *(SynchWaitParams **)iVar2;
    }
    else {
      waitp_local = *(SynchWaitParams **)iVar2;
    }
    pSStack_a0 = waitp_local;
  }
  if (*(long *)(cv_word[4].super___atomic_base<long>._M_i + 0x20) == 0) {
    *(atomic<long> **)(cv_word[4].super___atomic_base<long>._M_i + 0x20) = cv_word;
    p_Var5 = (__int_type_conflict *)((ulong)pSStack_a0 & 0xfffffffffffffffc);
    if (p_Var5 == (__int_type_conflict *)0x0) {
      *(__int_type_conflict *)cv_word[4].super___atomic_base<long>._M_i =
           cv_word[4].super___atomic_base<long>._M_i;
    }
    else {
      *(__int_type_conflict *)cv_word[4].super___atomic_base<long>._M_i = *p_Var5;
      *p_Var5 = cv_word[4].super___atomic_base<long>._M_i;
    }
    std::atomic<absl::lts_20250127::base_internal::PerThreadSynch::State>::store
              ((atomic<absl::lts_20250127::base_internal::PerThreadSynch::State> *)
               (cv_word[4].super___atomic_base<long>._M_i + 0x1c),kQueued,memory_order_relaxed);
    iVar2 = v;
    ___b_2 = (ulong)((uint)pSStack_a0 & 2) | cv_word[4].super___atomic_base<long>._M_i;
    local_10 = v;
    local_1c = 3;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_1c == 3) {
      *(ulong *)iVar2 = ___b_2;
    }
    else if (local_1c == 5) {
      LOCK();
      *(ulong *)iVar2 = ___b_2;
      UNLOCK();
    }
    else {
      *(ulong *)iVar2 = ___b_2;
    }
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0xa2a,"Check %s failed: %s","waitp->thread->waitp == nullptr",
             "waiting when shouldn\'t be");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0xa2a,"void absl::CondVarEnqueue(SynchWaitParams *)");
}

Assistant:

static void CondVarEnqueue(SynchWaitParams* waitp) {
  // This thread might be transferred to the Mutex queue by Fer() when
  // we are woken.  To make sure that is what happens, Enqueue() doesn't
  // call CondVarEnqueue() again but instead uses its normal code.  We
  // must do this before we queue ourselves so that cv_word will be null
  // when seen by the dequeuer, who may wish immediately to requeue
  // this thread on another queue.
  std::atomic<intptr_t>* cv_word = waitp->cv_word;
  waitp->cv_word = nullptr;

  intptr_t v = cv_word->load(std::memory_order_relaxed);
  int c = 0;
  while ((v & kCvSpin) != 0 ||  // acquire spinlock
         !cv_word->compare_exchange_weak(v, v | kCvSpin,
                                         std::memory_order_acquire,
                                         std::memory_order_relaxed)) {
    c = synchronization_internal::MutexDelay(c, GENTLE);
    v = cv_word->load(std::memory_order_relaxed);
  }
  ABSL_RAW_CHECK(waitp->thread->waitp == nullptr, "waiting when shouldn't be");
  waitp->thread->waitp = waitp;  // prepare ourselves for waiting
  PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
  if (h == nullptr) {  // add this thread to waiter list
    waitp->thread->next = waitp->thread;
  } else {
    waitp->thread->next = h->next;
    h->next = waitp->thread;
  }
  waitp->thread->state.store(PerThreadSynch::kQueued,
                             std::memory_order_relaxed);
  cv_word->store((v & kCvEvent) | reinterpret_cast<intptr_t>(waitp->thread),
                 std::memory_order_release);
}